

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

size_t __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::NeededBytesWithExtraSource(SDES *this)

{
  size_t sVar1;
  ulong uVar2;
  _Self __tmp;
  _List_node_base *p_Var3;
  long lVar4;
  
  p_Var3 = (this->sdessources).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)&this->sdessources) {
    sVar1 = 0;
  }
  else {
    lVar4 = 0;
    for (; p_Var3 != (_List_node_base *)&this->sdessources; p_Var3 = p_Var3->_M_next) {
      sVar1 = SDESSource::NeededBytes((SDESSource *)p_Var3[1]._M_next);
      lVar4 = lVar4 + sVar1;
    }
    uVar2 = (this->sdessources).
            super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ._M_impl._M_node._M_size + 1;
    sVar1 = lVar4 + ((uVar2 / 0x1f + 1) - (ulong)(uVar2 % 0x1f == 0)) * 4 + 8;
  }
  return sVar1;
}

Assistant:

size_t NeededBytesWithExtraSource()
		{
			std::list<SDESSource *>::const_iterator it;
			size_t x = 0;
			size_t n,d,r;
			
			if (sdessources.empty())
				return 0;
			
			for (it = sdessources.begin() ; it != sdessources.end() ; it++)
				x += (*it)->NeededBytes();
			
			// for the extra source we'll need at least 8 bytes (ssrc and four 0 bytes)
			x += sizeof(uint32_t)*2;
			
			n = sdessources.size() + 1; // also, the number of sources will increase
			d = n/31;
			r = n%31;
			if (r != 0)
				d++;
			x += d*sizeof(RTCPCommonHeader);
			return x;
		}